

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

uint64_t __thiscall kaitai::kstream::read_u8le(kstream *this)

{
  uint64_t local_18;
  uint64_t t;
  kstream *this_local;
  
  t = (uint64_t)this;
  std::istream::read((char *)this->m_io,(long)&local_18);
  return local_18;
}

Assistant:

uint64_t kaitai::kstream::read_u8le() {
    uint64_t t;
    m_io->read(reinterpret_cast<char *>(&t), 8);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_64(t);
#endif
    return t;
}